

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O3

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,quint64 u)

{
  _Head_base<0UL,_QCborStreamWriterPrivate_*,_false> _Var1;
  size_t sVar2;
  QIODevice *this_00;
  ulong uVar3;
  long lVar4;
  char cVar5;
  byte bVar6;
  size_t __n;
  long lVar7;
  long in_FS_OFFSET;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
       .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl;
  sVar2 = *(size_t *)((long)&(_Var1._M_head_impl)->encoder + 0x10);
  if (sVar2 != 0) {
    *(size_t *)((long)&(_Var1._M_head_impl)->encoder + 0x10) = sVar2 - 1;
  }
  lVar7 = (long)&local_10 + 7;
  uVar3 = u >> 0x38 | (u & 0xff000000000000) >> 0x28 | (u & 0xff0000000000) >> 0x18 |
          (u & 0xff00000000) >> 8 | (u & 0xff000000) << 8 | (u & 0xff0000) << 0x18 |
          (u & 0xff00) << 0x28;
  local_10 = uVar3 | u << 0x38;
  if (u < 0x18) {
    __n = u & 0xff;
    local_10 = CONCAT17((char)u,(int7)uVar3);
  }
  else {
    cVar5 = '\x02';
    if (u < 0x10000) {
      cVar5 = 0xff < u;
    }
    bVar6 = (cVar5 + '\x01') - (u >> 0x20 == 0);
    lVar4 = -1L << (bVar6 & 0x3f);
    lVar7 = lVar7 + lVar4;
    __n = (ulong)bVar6 | 0x18;
    *(char *)((long)&local_10 + lVar4 + 7) = (char)__n;
  }
  this_00 = *(QIODevice **)*(uint8_t **)((long)&(_Var1._M_head_impl)->encoder + 8);
  if (this_00 != (QIODevice *)0x0) {
    QIODevice::write(this_00,(int)lVar7,(void *)((long)&local_8 - lVar7),__n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborStreamWriter::append(quint64 u)
{
    d->executeAppend(cbor_encode_uint, uint64_t(u));
}